

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# collationweights.cpp
# Opt level: O1

UBool __thiscall
icu_63::CollationWeights::getWeightRanges
          (CollationWeights *this,uint32_t lowerLimit,uint32_t upperLimit)

{
  WeightRange *pWVar1;
  int iVar2;
  undefined8 uVar3;
  undefined8 uVar4;
  bool bVar5;
  uint uVar6;
  uint uVar7;
  uint32_t uVar8;
  long lVar9;
  ulong uVar10;
  byte bVar11;
  int iVar12;
  ulong uVar13;
  uint *puVar14;
  uint uVar15;
  uint32_t uVar16;
  uint32_t *puVar17;
  uint uVar18;
  long lVar19;
  WeightRange upper [5];
  WeightRange lower [5];
  undefined1 local_e8 [8];
  undefined1 local_e0 [8];
  uint local_d8 [17];
  undefined1 auStack_94 [8];
  undefined1 auStack_8c [8];
  uint32_t auStack_84 [21];
  
  uVar6 = 1;
  uVar15 = 1;
  if ((lowerLimit & 0xffffff) != 0) {
    if ((short)lowerLimit == 0) {
      uVar15 = 2;
    }
    else {
      uVar15 = 4 - ((char)lowerLimit == '\0');
    }
  }
  if ((upperLimit & 0xffffff) != 0) {
    if ((short)upperLimit == 0) {
      uVar6 = 2;
    }
    else {
      uVar6 = 4 - ((char)upperLimit == '\0');
    }
  }
  if ((lowerLimit < upperLimit) &&
     ((uVar6 <= uVar15 ||
      (bVar11 = (char)uVar15 * -8, (upperLimit >> (bVar11 & 0x1f)) << (bVar11 & 0x1f) != lowerLimit)
      ))) {
    stack0xffffffffffffff78 = 0;
    auStack_84[1] = 0;
    auStack_84[2] = 0;
    auStack_84[3] = 0;
    auStack_84[4] = 0;
    auStack_84[5] = 0;
    auStack_84[6] = 0;
    auStack_84[7] = 0;
    auStack_84[8] = 0;
    auStack_84[9] = 0;
    auStack_84[10] = 0;
    auStack_84[0xb] = 0;
    auStack_84[0xc] = 0;
    auStack_84[0xd] = 0;
    auStack_84[0xe] = 0;
    auStack_84[0xf] = 0;
    auStack_84[0x10] = 0;
    auStack_84[0x11] = 0;
    auStack_84[0x12] = 0;
    local_d8[0] = 0;
    local_d8[1] = 0;
    local_d8[2] = 0;
    local_d8[3] = 0;
    local_d8[4] = 0;
    local_d8[5] = 0;
    local_d8[6] = 0;
    local_d8[7] = 0;
    local_d8[8] = 0;
    local_d8[9] = 0;
    local_d8[10] = 0;
    local_d8[0xb] = 0;
    local_d8[0xc] = 0;
    local_d8[0xd] = 0;
    local_d8[0xe] = 0;
    local_d8[0xf] = 0;
    stack0xffffffffffffff68 = 0;
    stack0xffffffffffffff70 = 0;
    iVar2 = this->middleLength;
    lVar19 = (long)iVar2;
    if (iVar2 < (int)uVar15) {
      uVar13 = (ulong)uVar15;
      puVar17 = auStack_84 + uVar13 * 4 + 2;
      iVar12 = uVar15 * -8 + 0x20;
      do {
        bVar11 = (byte)iVar12;
        uVar18 = lowerLimit >> (bVar11 & 0x1f) & 0xff;
        uVar15 = this->maxBytes[uVar13];
        uVar16 = uVar15 - uVar18;
        if (uVar18 <= uVar15 && uVar16 != 0) {
          puVar17[-3] = (int)(1L << (bVar11 & 0x3f)) + lowerLimit;
          puVar17[-2] = uVar15 << (bVar11 & 0x1f) | -0x100 << (bVar11 & 0x1f) & lowerLimit;
          puVar17[-1] = (uint32_t)uVar13;
          *puVar17 = uVar16;
        }
        iVar12 = iVar12 + 8;
        lowerLimit = (lowerLimit >> ((byte)iVar12 & 0x1f)) << ((byte)iVar12 & 0x1f);
        uVar13 = uVar13 - 1;
        puVar17 = puVar17 + -4;
      } while (lVar19 < (long)uVar13);
    }
    uVar15 = 0xffffffff;
    if (lowerLimit < 0xff000000) {
      uVar15 = (int)(1L << (-((char)iVar2 * '\b' + ' ') & 0x3fU)) + lowerLimit;
    }
    if (iVar2 < (int)uVar6) {
      uVar13 = (ulong)uVar6;
      puVar14 = local_d8 + uVar13 * 4 + 3;
      iVar12 = uVar6 * -8 + 0x20;
      do {
        bVar11 = (byte)iVar12;
        uVar18 = upperLimit >> (bVar11 & 0x1f) & 0xff;
        uVar6 = this->minBytes[uVar13];
        uVar7 = uVar18 - uVar6;
        if (uVar6 <= uVar18 && uVar7 != 0) {
          puVar14[-3] = uVar6 << (bVar11 & 0x1f) | -0x100 << (bVar11 & 0x1f) & upperLimit;
          puVar14[-2] = (int)(-1L << (bVar11 & 0x3f)) + upperLimit;
          puVar14[-1] = (uint)uVar13;
          *puVar14 = uVar7;
        }
        iVar12 = iVar12 + 8;
        upperLimit = (upperLimit >> ((byte)iVar12 & 0x1f)) << ((byte)iVar12 & 0x1f);
        uVar13 = uVar13 - 1;
        puVar14 = puVar14 + -4;
      } while (lVar19 < (long)uVar13);
    }
    bVar11 = (char)iVar2 * -8 + 0x20;
    uVar6 = (int)(-1L << (bVar11 & 0x3f)) + upperLimit;
    if (uVar6 < uVar15) {
      if (iVar2 < 4) {
        uVar13 = 4;
        do {
          iVar12 = (int)uVar13;
          lVar9 = (long)iVar12;
          uVar16 = auStack_84[lVar9 * 4 + 2];
          if ((0 < (int)uVar16) && (uVar18 = local_d8[lVar9 * 4 + 3], 0 < (int)uVar18)) {
            local_e8 = (undefined1  [8])(auStack_8c + lVar9 * 0x10 + 4);
            local_e0 = (undefined1  [8])(local_d8 + lVar9 * 4);
            uVar8 = auStack_84[lVar9 * 4];
            uVar7 = *(uint *)local_e0;
            if (uVar7 < uVar8) {
              uVar18 = local_d8[lVar9 * 4 + 1];
              auStack_84[lVar9 * 4] = uVar18;
              bVar11 = (char)uVar13 * -8;
              uVar18 = ((uVar18 >> (bVar11 & 0x1f) & 0xff) -
                       (*(uint *)local_e8 >> (bVar11 & 0x1f) & 0xff)) + 1;
LAB_0023b161:
              *(uint *)((long)local_e8 + 0xc) = uVar18;
              bVar5 = false;
            }
            else {
              bVar5 = true;
              if (uVar8 != uVar7) {
                uVar8 = incWeight(this,uVar8,iVar12);
                bVar5 = true;
                if (uVar8 == uVar7) {
                  *(uint *)((long)local_e8 + 4) = *(uint *)((long)local_e0 + 4);
                  uVar18 = uVar18 + uVar16;
                  goto LAB_0023b161;
                }
              }
            }
            if (!bVar5) {
              *(uint *)((long)local_e0 + 0xc) = 0;
              uVar18 = iVar12 - 1;
              uVar13 = (ulong)uVar18;
              if (iVar2 < (int)uVar18) {
                uVar13 = (ulong)(int)uVar18;
                uVar10 = uVar13 << 4 | 0xc;
                do {
                  *(undefined4 *)((long)local_d8 + uVar10) = 0;
                  *(undefined4 *)(auStack_8c + uVar10 + 4) = 0;
                  uVar13 = uVar13 - 1;
                  uVar10 = uVar10 - 0x10;
                } while (lVar19 < (long)uVar13);
              }
            }
            iVar12 = (int)uVar13;
            if (!bVar5) break;
          }
          uVar13 = (ulong)(iVar12 - 1U);
        } while (iVar2 < (int)(iVar12 - 1U));
        iVar12 = 0;
      }
      else {
        iVar12 = 0;
      }
    }
    else {
      iVar12 = (uVar6 - uVar15 >> (bVar11 & 0x1f)) + 1;
    }
    this->rangeCount = 0;
    if (0 < iVar12) {
      this->ranges[0].start = uVar15;
      this->ranges[0].end = uVar6;
      this->ranges[0].length = iVar2;
      this->ranges[0].count = iVar12;
      this->rangeCount = 1;
    }
    if (iVar2 < 4) {
      lVar9 = lVar19 + -4;
      lVar19 = lVar19 * 0x10 + 0x1c;
      do {
        if (0 < *(int *)((long)local_d8 + lVar19)) {
          uVar3 = *(undefined8 *)(local_e8 + lVar19 + 4);
          uVar4 = *(undefined8 *)(local_e0 + lVar19 + 4);
          pWVar1 = this->ranges + this->rangeCount;
          pWVar1->start = (int)uVar3;
          pWVar1->end = (int)((ulong)uVar3 >> 0x20);
          pWVar1->length = (int)uVar4;
          pWVar1->count = (int)((ulong)uVar4 >> 0x20);
          this->rangeCount = this->rangeCount + 1;
        }
        if (0 < *(int *)(auStack_8c + lVar19 + 4)) {
          uVar3 = *(undefined8 *)(auStack_94 + lVar19);
          uVar4 = *(undefined8 *)(auStack_8c + lVar19);
          pWVar1 = this->ranges + this->rangeCount;
          pWVar1->start = (int)uVar3;
          pWVar1->end = (int)((ulong)uVar3 >> 0x20);
          pWVar1->length = (int)uVar4;
          pWVar1->count = (int)((ulong)uVar4 >> 0x20);
          this->rangeCount = this->rangeCount + 1;
        }
        lVar19 = lVar19 + 0x10;
        lVar9 = lVar9 + 1;
      } while (lVar9 != 0);
    }
    bVar5 = 0 < this->rangeCount;
  }
  else {
    bVar5 = false;
  }
  return bVar5;
}

Assistant:

UBool
CollationWeights::getWeightRanges(uint32_t lowerLimit, uint32_t upperLimit) {
    U_ASSERT(lowerLimit != 0);
    U_ASSERT(upperLimit != 0);

    /* get the lengths of the limits */
    int32_t lowerLength=lengthOfWeight(lowerLimit);
    int32_t upperLength=lengthOfWeight(upperLimit);

#ifdef UCOL_DEBUG
    printf("length of lower limit 0x%08lx is %ld\n", lowerLimit, lowerLength);
    printf("length of upper limit 0x%08lx is %ld\n", upperLimit, upperLength);
#endif
    U_ASSERT(lowerLength>=middleLength);
    // Permit upperLength<middleLength: The upper limit for secondaries is 0x10000.

    if(lowerLimit>=upperLimit) {
#ifdef UCOL_DEBUG
        printf("error: no space between lower & upper limits\n");
#endif
        return FALSE;
    }

    /* check that neither is a prefix of the other */
    if(lowerLength<upperLength) {
        if(lowerLimit==truncateWeight(upperLimit, lowerLength)) {
#ifdef UCOL_DEBUG
            printf("error: lower limit 0x%08lx is a prefix of upper limit 0x%08lx\n", lowerLimit, upperLimit);
#endif
            return FALSE;
        }
    }
    /* if the upper limit is a prefix of the lower limit then the earlier test lowerLimit>=upperLimit has caught it */

    WeightRange lower[5], middle, upper[5]; /* [0] and [1] are not used - this simplifies indexing */
    uprv_memset(lower, 0, sizeof(lower));
    uprv_memset(&middle, 0, sizeof(middle));
    uprv_memset(upper, 0, sizeof(upper));

    /*
     * With the limit lengths of 1..4, there are up to 7 ranges for allocation:
     * range     minimum length
     * lower[4]  4
     * lower[3]  3
     * lower[2]  2
     * middle    1
     * upper[2]  2
     * upper[3]  3
     * upper[4]  4
     *
     * We are now going to calculate up to 7 ranges.
     * Some of them will typically overlap, so we will then have to merge and eliminate ranges.
     */
    uint32_t weight=lowerLimit;
    for(int32_t length=lowerLength; length>middleLength; --length) {
        uint32_t trail=getWeightTrail(weight, length);
        if(trail<maxBytes[length]) {
            lower[length].start=incWeightTrail(weight, length);
            lower[length].end=setWeightTrail(weight, length, maxBytes[length]);
            lower[length].length=length;
            lower[length].count=maxBytes[length]-trail;
        }
        weight=truncateWeight(weight, length-1);
    }
    if(weight<0xff000000) {
        middle.start=incWeightTrail(weight, middleLength);
    } else {
        // Prevent overflow for primary lead byte FF
        // which would yield a middle range starting at 0.
        middle.start=0xffffffff;  // no middle range
    }

    weight=upperLimit;
    for(int32_t length=upperLength; length>middleLength; --length) {
        uint32_t trail=getWeightTrail(weight, length);
        if(trail>minBytes[length]) {
            upper[length].start=setWeightTrail(weight, length, minBytes[length]);
            upper[length].end=decWeightTrail(weight, length);
            upper[length].length=length;
            upper[length].count=trail-minBytes[length];
        }
        weight=truncateWeight(weight, length-1);
    }
    middle.end=decWeightTrail(weight, middleLength);

    /* set the middle range */
    middle.length=middleLength;
    if(middle.end>=middle.start) {
        middle.count=(int32_t)((middle.end-middle.start)>>(8*(4-middleLength)))+1;
    } else {
        /* no middle range, eliminate overlaps */
        for(int32_t length=4; length>middleLength; --length) {
            if(lower[length].count>0 && upper[length].count>0) {
                // Note: The lowerEnd and upperStart weights are versions of
                // lowerLimit and upperLimit (which are lowerLimit<upperLimit),
                // truncated (still less-or-equal)
                // and then with their last bytes changed to the
                // maxByte (for lowerEnd) or minByte (for upperStart).
                const uint32_t lowerEnd=lower[length].end;
                const uint32_t upperStart=upper[length].start;
                UBool merged=FALSE;

                if(lowerEnd>upperStart) {
                    // These two lower and upper ranges collide.
                    // Since lowerLimit<upperLimit and lowerEnd and upperStart
                    // are versions with only their last bytes modified
                    // (and following ones removed/reset to 0),
                    // lowerEnd>upperStart is only possible
                    // if the leading bytes are equal
                    // and lastByte(lowerEnd)>lastByte(upperStart).
                    U_ASSERT(truncateWeight(lowerEnd, length-1)==
                            truncateWeight(upperStart, length-1));
                    // Intersect these two ranges.
                    lower[length].end=upper[length].end;
                    lower[length].count=
                            (int32_t)getWeightTrail(lower[length].end, length)-
                            (int32_t)getWeightTrail(lower[length].start, length)+1;
                    // count might be <=0 in which case there is no room,
                    // and the range-collecting code below will ignore this range.
                    merged=TRUE;
                } else if(lowerEnd==upperStart) {
                    // Not possible, unless minByte==maxByte which is not allowed.
                    U_ASSERT(minBytes[length]<maxBytes[length]);
                } else /* lowerEnd<upperStart */ {
                    if(incWeight(lowerEnd, length)==upperStart) {
                        // Merge adjacent ranges.
                        lower[length].end=upper[length].end;
                        lower[length].count+=upper[length].count;  // might be >countBytes
                        merged=TRUE;
                    }
                }
                if(merged) {
                    // Remove all shorter ranges.
                    // There was no room available for them between the ranges we just merged.
                    upper[length].count=0;
                    while(--length>middleLength) {
                        lower[length].count=upper[length].count=0;
                    }
                    break;
                }
            }
        }
    }

#ifdef UCOL_DEBUG
    /* print ranges */
    for(int32_t length=4; length>=2; --length) {
        if(lower[length].count>0) {
            printf("lower[%ld] .start=0x%08lx .end=0x%08lx .count=%ld\n", length, lower[length].start, lower[length].end, lower[length].count);
        }
    }
    if(middle.count>0) {
        printf("middle   .start=0x%08lx .end=0x%08lx .count=%ld\n", middle.start, middle.end, middle.count);
    }
    for(int32_t length=2; length<=4; ++length) {
        if(upper[length].count>0) {
            printf("upper[%ld] .start=0x%08lx .end=0x%08lx .count=%ld\n", length, upper[length].start, upper[length].end, upper[length].count);
        }
    }
#endif

    /* copy the ranges, shortest first, into the result array */
    rangeCount=0;
    if(middle.count>0) {
        uprv_memcpy(ranges, &middle, sizeof(WeightRange));
        rangeCount=1;
    }
    for(int32_t length=middleLength+1; length<=4; ++length) {
        /* copy upper first so that later the middle range is more likely the first one to use */
        if(upper[length].count>0) {
            uprv_memcpy(ranges+rangeCount, upper+length, sizeof(WeightRange));
            ++rangeCount;
        }
        if(lower[length].count>0) {
            uprv_memcpy(ranges+rangeCount, lower+length, sizeof(WeightRange));
            ++rangeCount;
        }
    }
    return rangeCount>0;
}